

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O2

int str_lower(lua_State *L)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  size_t l;
  luaL_Buffer b;
  
  pcVar3 = luaL_checklstring(L,1,&l);
  luaL_buffinit(L,&b);
  for (uVar4 = 0; uVar4 < l; uVar4 = uVar4 + 1) {
    if (&stack0xffffffffffffffd8 <= b.p) {
      luaL_prepbuffer(&b);
    }
    pcVar1 = b.p;
    iVar2 = tolower((uint)(byte)pcVar3[uVar4]);
    b.p = pcVar1 + 1;
    *pcVar1 = (char)iVar2;
  }
  luaL_pushresult(&b);
  return 1;
}

Assistant:

static int str_lower (lua_State *L) {
  size_t l;
  size_t i;
  luaL_Buffer b;
  const char *s = luaL_checklstring(L, 1, &l);
  luaL_buffinit(L, &b);
  for (i=0; i<l; i++)
    luaL_addchar(&b, tolower(uchar(s[i])));
  luaL_pushresult(&b);
  return 1;
}